

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O0

void __thiscall state_t::state_t(state_t *this,state_t *param_1)

{
  state_t *param_1_local;
  state_t *this_local;
  
  std::
  vector<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>,_std::allocator<std::pair<unsigned_long,_generic_tile_t<10UL>::rotation_e>_>_>_>_>
  ::vector(&this->image,&param_1->image);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&this->available,&param_1->available);
  this->row = param_1->row;
  this->col = param_1->col;
  this->w = param_1->w;
  this->h = param_1->h;
  return;
}

Assistant:

state_t(size_t width, size_t height, const tiles_t& tiles)
      : w{width}, h{height}, image(height, image_t::value_type(width))
  {
    for (const auto& t : tiles) {
      available.insert(t.first);
    }
  }